

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

Result<void> * __thiscall
ChainstateManager::PopulateAndValidateSnapshot
          (Result<void> *__return_storage_ptr__,ChainstateManager *this,
          Chainstate *snapshot_chainstate,AutoFile *coins_file,SnapshotMetadata *metadata)

{
  int height;
  long lVar1;
  string original;
  string original_00;
  string original_01;
  string original_02;
  string original_03;
  string original_04;
  string original_05;
  string original_06;
  bool bVar2;
  CoinsCacheSizeState CVar3;
  CCoinsViewCache *this_00;
  CBlockIndex *pb;
  CBlockIndex *pa;
  uint64_t uVar4;
  uint64_t uVar5;
  size_t sVar6;
  char *args;
  int i;
  string *psVar7;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  undefined8 in_stack_fffffffffffff858;
  ChainstateManager *pCVar8;
  allocator<char> local_771;
  int64_t coins_processed;
  uint64_t coins_left;
  uint64_t coins_count;
  int base_height;
  CBlockIndex *snapshot_start_block;
  unique_lock<std::recursive_mutex> local_748 [19];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock55;
  uint local_5f0;
  optional<kernel::CCoinsStats> maybe_stats;
  string local_468 [32];
  bilingual_str local_448 [2];
  string local_3a8 [32];
  bilingual_str local_388;
  string local_348 [32];
  bilingual_str local_328;
  string local_2e8 [32];
  bilingual_str local_2c8;
  CBlockIndex *index;
  uchar auStack_280 [24];
  uint32_t local_268;
  string local_258 [32];
  bilingual_str local_238;
  Txid txid;
  string local_1d0 [32];
  bilingual_str local_1b0;
  string local_170 [32];
  bilingual_str local_150;
  optional<AssumeutxoData> local_110;
  string local_b8 [32];
  bilingual_str local_98;
  uint256 base_blockhash;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&maybe_stats,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,0x16cb,false);
  this_00 = Chainstate::CoinsTip(snapshot_chainstate);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&maybe_stats);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems;
  base_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 8);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x10);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x18);
  args = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp";
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&maybe_stats,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,0x16cf,false);
  pb = ::node::BlockManager::LookupBlockIndex(&this->m_blockman,&base_blockhash);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&maybe_stats);
  snapshot_start_block = pb;
  if (pb == (CBlockIndex *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_b8,"Did not find snapshot start blockheader %s",(allocator<char> *)&local_110);
    original._M_string_length = (size_type)__return_storage_ptr__;
    original._M_dataplus._M_p = (pointer)in_stack_fffffffffffff858;
    original.field_2._M_allocated_capacity = (size_type)snapshot_chainstate;
    original.field_2._8_8_ = this;
    Untranslated((bilingual_str *)&maybe_stats,original);
    base_blob<256u>::ToString_abi_cxx11_
              ((string *)&criticalblock55,(base_blob<256u> *)&base_blockhash);
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)&maybe_stats,(bilingual_str *)&criticalblock55,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
               &local_98);
    bilingual_str::~bilingual_str(&local_98);
    std::__cxx11::string::~string((string *)&criticalblock55);
    bilingual_str::~bilingual_str((bilingual_str *)&maybe_stats);
    psVar7 = local_b8;
  }
  else {
    height = pb->nHeight;
    pCVar8 = this;
    base_height = height;
    CChainParams::AssumeutxoForHeight(&local_110,(this->m_options).chainparams,height);
    if (local_110.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
        super__Optional_payload_base<AssumeutxoData>._M_engaged == false) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_170,
                 "Assumeutxo height in snapshot metadata not recognized (%d) - refusing to load snapshot"
                 ,(allocator<char> *)&criticalblock55);
      original_00._M_string_length = (size_type)__return_storage_ptr__;
      original_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff858;
      original_00.field_2._M_allocated_capacity = (size_type)snapshot_chainstate;
      original_00.field_2._8_8_ = pCVar8;
      Untranslated((bilingual_str *)&maybe_stats,original_00);
      tinyformat::format<int>(&local_150,(bilingual_str *)&maybe_stats,&base_height);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                 &local_150);
      bilingual_str::~bilingual_str(&local_150);
      bilingual_str::~bilingual_str((bilingual_str *)&maybe_stats);
      psVar7 = local_170;
    }
    else {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&maybe_stats,&cs_main,
                 "::cs_main",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                 ,0x16e5,false);
      pa = ActiveTip(this);
      bVar2 = ::node::CBlockIndexWorkComparator::operator()
                        ((CBlockIndexWorkComparator *)&criticalblock55,pa,pb);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&maybe_stats);
      if (bVar2) {
        coins_left = metadata->m_coins_count;
        coins_count = coins_left;
        base_blob<256u>::ToString_abi_cxx11_
                  ((string *)&maybe_stats,(base_blob<256u> *)&base_blockhash);
        logging_function._M_str = "PopulateAndValidateSnapshot";
        logging_function._M_len = 0x1b;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x5e;
        LogPrintFormatInternal<unsigned_long,std::__cxx11::string>
                  (logging_function,source_file,0x16ec,ALL,Info,(ConstevalFormatString<2U>)0x6c607d,
                   &coins_left,(string *)&maybe_stats);
        std::__cxx11::string::~string((string *)&maybe_stats);
        coins_processed = 0;
        while (coins_left != 0) {
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
          txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
          base_blob<256U>::Unserialize<AutoFile>((base_blob<256U> *)&txid,coins_file);
          uVar4 = ReadCompactSize<AutoFile>(coins_file,true);
          if (coins_left < uVar4) {
            std::__cxx11::string::string<std::allocator<char>>
                      (local_258,
                       "Mismatch in coins count in snapshot metadata and actual snapshot data",
                       (allocator<char> *)&maybe_stats);
            original_06._M_string_length = (size_type)__return_storage_ptr__;
            original_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff858;
            original_06.field_2._M_allocated_capacity = (size_type)snapshot_chainstate;
            original_06.field_2._8_8_ = pCVar8;
            Untranslated(&local_238,original_06);
            std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
            _Variant_storage<0ul,bilingual_str>
                      ((_Variant_storage<false,bilingual_str,std::monostate> *)
                       __return_storage_ptr__,&local_238);
            bilingual_str::~bilingual_str(&local_238);
            psVar7 = local_258;
            goto LAB_0036be69;
          }
          while (bVar2 = uVar4 != 0, uVar4 = uVar4 - 1, bVar2) {
            auStack_280[8] = '\0';
            auStack_280[9] = '\0';
            auStack_280[10] = '\0';
            auStack_280[0xb] = '\0';
            auStack_280[0xc] = '\0';
            auStack_280[0xd] = '\0';
            auStack_280[0xe] = '\0';
            auStack_280[0xf] = '\0';
            auStack_280[0x10] = '\0';
            auStack_280[0x11] = '\0';
            auStack_280[0x12] = '\0';
            auStack_280[0x13] = '\0';
            auStack_280[0x14] = '\0';
            auStack_280[0x15] = '\0';
            auStack_280[0x16] = '\0';
            auStack_280[0x17] = '\0';
            index = (CBlockIndex *)0x0;
            auStack_280[0] = '\0';
            auStack_280[1] = '\0';
            auStack_280[2] = '\0';
            auStack_280[3] = '\0';
            auStack_280[4] = '\0';
            auStack_280[5] = '\0';
            auStack_280[6] = '\0';
            auStack_280[7] = '\0';
            local_268 = 0xffffffff;
            Coin::Coin((Coin *)&criticalblock55);
            uVar5 = ReadCompactSize<AutoFile>(coins_file,true);
            local_268 = (uint32_t)uVar5;
            index = (CBlockIndex *)txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
            auStack_280[0] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[8];
            auStack_280[1] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[9];
            auStack_280[2] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[10];
            auStack_280[3] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb];
            auStack_280[4] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc];
            auStack_280[5] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd];
            auStack_280[6] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe];
            auStack_280[7] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf];
            auStack_280[8] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
            auStack_280[9] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
            auStack_280[10] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
            auStack_280[0xb] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
            auStack_280[0xc] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
            auStack_280[0xd] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
            auStack_280[0xe] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
            auStack_280[0xf] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
            auStack_280[0x10] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
            auStack_280[0x11] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
            auStack_280[0x12] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
            auStack_280[0x13] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
            auStack_280[0x14] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
            auStack_280[0x15] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
            auStack_280[0x16] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
            auStack_280[0x17] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
            Coin::Unserialize<AutoFile>((Coin *)&criticalblock55,coins_file);
            if ((height < (int)(local_5f0 >> 1)) || (local_268 == 0xffffffff)) {
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2e8,"Bad snapshot data after deserializing %d coins",&local_771);
              original_02._M_string_length = (size_type)__return_storage_ptr__;
              original_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff858;
              original_02.field_2._M_allocated_capacity = (size_type)snapshot_chainstate;
              original_02.field_2._8_8_ = pCVar8;
              Untranslated((bilingual_str *)&maybe_stats,original_02);
              local_748[0]._M_device = (mutex_type *)(coins_count - coins_left);
              tinyformat::format<unsigned_long>
                        (&local_2c8,(bilingual_str *)&maybe_stats,(unsigned_long *)local_748);
              std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
              _Variant_storage<0ul,bilingual_str>
                        ((_Variant_storage<false,bilingual_str,std::monostate> *)
                         __return_storage_ptr__,&local_2c8);
              bilingual_str::~bilingual_str(&local_2c8);
              bilingual_str::~bilingual_str((bilingual_str *)&maybe_stats);
              psVar7 = local_2e8;
LAB_0036c00d:
              std::__cxx11::string::~string(psVar7);
              prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                         &criticalblock55.super_unique_lock._M_owns);
              goto LAB_0036be6e;
            }
            if ((mutex_type *)0x775f05a074000 < criticalblock55.super_unique_lock._M_device) {
              std::__cxx11::string::string<std::allocator<char>>
                        (local_348,
                         "Bad snapshot data after deserializing %d coins - bad tx out value",
                         &local_771);
              original_03._M_string_length = (size_type)__return_storage_ptr__;
              original_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff858;
              original_03.field_2._M_allocated_capacity = (size_type)snapshot_chainstate;
              original_03.field_2._8_8_ = pCVar8;
              Untranslated((bilingual_str *)&maybe_stats,original_03);
              local_748[0]._M_device = (mutex_type *)(coins_count - coins_left);
              tinyformat::format<unsigned_long>
                        (&local_328,(bilingual_str *)&maybe_stats,(unsigned_long *)local_748);
              std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
              _Variant_storage<0ul,bilingual_str>
                        ((_Variant_storage<false,bilingual_str,std::monostate> *)
                         __return_storage_ptr__,&local_328);
              bilingual_str::~bilingual_str(&local_328);
              bilingual_str::~bilingual_str((bilingual_str *)&maybe_stats);
              psVar7 = local_348;
              goto LAB_0036c00d;
            }
            CCoinsViewCache::EmplaceCoinInternalDANGER
                      (this_00,(COutPoint *)&index,(Coin *)&criticalblock55);
            coins_left = coins_left - 1;
            coins_processed = coins_processed + 1;
            if (coins_processed % 1000000 == 0) {
              local_748[0]._M_device =
                   (mutex_type *)
                   CONCAT44(local_748[0]._M_device._4_4_,
                            ((float)coins_processed * 100.0) / (float)coins_count);
              sVar6 = CCoinsViewCache::DynamicMemoryUsage(this_00);
              maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
              super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ = sVar6 / 1000000;
              logging_function_00._M_str = "PopulateAndValidateSnapshot";
              logging_function_00._M_len = 0x1b;
              source_file_00._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
              ;
              source_file_00._M_len = 0x5e;
              LogPrintFormatInternal<long,float,unsigned_long>
                        (logging_function_00,source_file_00,0x1713,ALL,Info,
                         (ConstevalFormatString<3U>)0x6c6162,&coins_processed,(float *)local_748,
                         (unsigned_long *)&maybe_stats);
            }
            if (coins_processed % 120000 == 0) {
              bVar2 = util::SignalInterrupt::operator_cast_to_bool(pCVar8->m_interrupt);
              if (bVar2) {
                std::__cxx11::string::string<std::allocator<char>>
                          (local_3a8,"Aborting after an interrupt was requested",
                           (allocator<char> *)&maybe_stats);
                original_04._M_string_length = (size_type)__return_storage_ptr__;
                original_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff858;
                original_04.field_2._M_allocated_capacity = (size_type)snapshot_chainstate;
                original_04.field_2._8_8_ = pCVar8;
                Untranslated(&local_388,original_04);
                std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
                _Variant_storage<0ul,bilingual_str>
                          ((_Variant_storage<false,bilingual_str,std::monostate> *)
                           __return_storage_ptr__,&local_388);
                bilingual_str::~bilingual_str(&local_388);
                psVar7 = local_3a8;
                goto LAB_0036c00d;
              }
              UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                        ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_748,&cs_main,
                         "::cs_main",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                         ,0x1720,false);
              CVar3 = Chainstate::GetCoinsCacheSizeState(snapshot_chainstate);
              std::unique_lock<std::recursive_mutex>::~unique_lock(local_748);
              if (LARGE < CVar3) {
                GetRandHash();
                CCoinsViewCache::SetBestBlock(this_00,(uint256 *)&maybe_stats);
                FlushSnapshotToDisk(this_00,false);
              }
            }
            prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                       &criticalblock55.super_unique_lock._M_owns);
          }
        }
        CCoinsViewCache::SetBestBlock(this_00,&base_blockhash);
        ser_readdata8<AutoFile>(coins_file);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_468,"Bad snapshot - coins left over after deserializing %d coins",
                   (allocator<char> *)&criticalblock55);
        original_05._M_string_length = (size_type)__return_storage_ptr__;
        original_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff858;
        original_05.field_2._M_allocated_capacity = (size_type)snapshot_chainstate;
        original_05.field_2._8_8_ = pCVar8;
        Untranslated((bilingual_str *)&maybe_stats,original_05);
        tinyformat::format<unsigned_long>(local_448,(bilingual_str *)&maybe_stats,&coins_count);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                   local_448);
        bilingual_str::~bilingual_str(local_448);
        bilingual_str::~bilingual_str((bilingual_str *)&maybe_stats);
        psVar7 = local_468;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1d0,"Work does not exceed active chainstate",
                   (allocator<char> *)&maybe_stats);
        original_01._M_string_length = (size_type)__return_storage_ptr__;
        original_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff858;
        original_01.field_2._M_allocated_capacity = (size_type)snapshot_chainstate;
        original_01.field_2._8_8_ = pCVar8;
        Untranslated(&local_1b0,original_01);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                   &local_1b0);
        bilingual_str::~bilingual_str(&local_1b0);
        psVar7 = local_1d0;
      }
    }
  }
LAB_0036be69:
  std::__cxx11::string::~string(psVar7);
LAB_0036be6e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Result<void> *)
           (_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> ChainstateManager::PopulateAndValidateSnapshot(
    Chainstate& snapshot_chainstate,
    AutoFile& coins_file,
    const SnapshotMetadata& metadata)
{
    // It's okay to release cs_main before we're done using `coins_cache` because we know
    // that nothing else will be referencing the newly created snapshot_chainstate yet.
    CCoinsViewCache& coins_cache = *WITH_LOCK(::cs_main, return &snapshot_chainstate.CoinsTip());

    uint256 base_blockhash = metadata.m_base_blockhash;

    CBlockIndex* snapshot_start_block = WITH_LOCK(::cs_main, return m_blockman.LookupBlockIndex(base_blockhash));

    if (!snapshot_start_block) {
        // Needed for ComputeUTXOStats to determine the
        // height and to avoid a crash when base_blockhash.IsNull()
        return util::Error{strprintf(Untranslated("Did not find snapshot start blockheader %s"),
                  base_blockhash.ToString())};
    }

    int base_height = snapshot_start_block->nHeight;
    const auto& maybe_au_data = GetParams().AssumeutxoForHeight(base_height);

    if (!maybe_au_data) {
        return util::Error{strprintf(Untranslated("Assumeutxo height in snapshot metadata not recognized "
                  "(%d) - refusing to load snapshot"), base_height)};
    }

    const AssumeutxoData& au_data = *maybe_au_data;

    // This work comparison is a duplicate check with the one performed later in
    // ActivateSnapshot(), but is done so that we avoid doing the long work of staging
    // a snapshot that isn't actually usable.
    if (WITH_LOCK(::cs_main, return !CBlockIndexWorkComparator()(ActiveTip(), snapshot_start_block))) {
        return util::Error{Untranslated("Work does not exceed active chainstate")};
    }

    const uint64_t coins_count = metadata.m_coins_count;
    uint64_t coins_left = metadata.m_coins_count;

    LogPrintf("[snapshot] loading %d coins from snapshot %s\n", coins_left, base_blockhash.ToString());
    int64_t coins_processed{0};

    while (coins_left > 0) {
        try {
            Txid txid;
            coins_file >> txid;
            size_t coins_per_txid{0};
            coins_per_txid = ReadCompactSize(coins_file);

            if (coins_per_txid > coins_left) {
                return util::Error{Untranslated("Mismatch in coins count in snapshot metadata and actual snapshot data")};
            }

            for (size_t i = 0; i < coins_per_txid; i++) {
                COutPoint outpoint;
                Coin coin;
                outpoint.n = static_cast<uint32_t>(ReadCompactSize(coins_file));
                outpoint.hash = txid;
                coins_file >> coin;
                if (coin.nHeight > base_height ||
                    outpoint.n >= std::numeric_limits<decltype(outpoint.n)>::max() // Avoid integer wrap-around in coinstats.cpp:ApplyHash
                ) {
                    return util::Error{strprintf(Untranslated("Bad snapshot data after deserializing %d coins"),
                              coins_count - coins_left)};
                }
                if (!MoneyRange(coin.out.nValue)) {
                    return util::Error{strprintf(Untranslated("Bad snapshot data after deserializing %d coins - bad tx out value"),
                              coins_count - coins_left)};
                }
                coins_cache.EmplaceCoinInternalDANGER(std::move(outpoint), std::move(coin));

                --coins_left;
                ++coins_processed;

                if (coins_processed % 1000000 == 0) {
                    LogPrintf("[snapshot] %d coins loaded (%.2f%%, %.2f MB)\n",
                        coins_processed,
                        static_cast<float>(coins_processed) * 100 / static_cast<float>(coins_count),
                        coins_cache.DynamicMemoryUsage() / (1000 * 1000));
                }

                // Batch write and flush (if we need to) every so often.
                //
                // If our average Coin size is roughly 41 bytes, checking every 120,000 coins
                // means <5MB of memory imprecision.
                if (coins_processed % 120000 == 0) {
                    if (m_interrupt) {
                        return util::Error{Untranslated("Aborting after an interrupt was requested")};
                    }

                    const auto snapshot_cache_state = WITH_LOCK(::cs_main,
                        return snapshot_chainstate.GetCoinsCacheSizeState());

                    if (snapshot_cache_state >= CoinsCacheSizeState::CRITICAL) {
                        // This is a hack - we don't know what the actual best block is, but that
                        // doesn't matter for the purposes of flushing the cache here. We'll set this
                        // to its correct value (`base_blockhash`) below after the coins are loaded.
                        coins_cache.SetBestBlock(GetRandHash());

                        // No need to acquire cs_main since this chainstate isn't being used yet.
                        FlushSnapshotToDisk(coins_cache, /*snapshot_loaded=*/false);
                    }
                }
            }
        } catch (const std::ios_base::failure&) {
            return util::Error{strprintf(Untranslated("Bad snapshot format or truncated snapshot after deserializing %d coins"),
                      coins_processed)};
        }
    }

    // Important that we set this. This and the coins_cache accesses above are
    // sort of a layer violation, but either we reach into the innards of
    // CCoinsViewCache here or we have to invert some of the Chainstate to
    // embed them in a snapshot-activation-specific CCoinsViewCache bulk load
    // method.
    coins_cache.SetBestBlock(base_blockhash);

    bool out_of_coins{false};
    try {
        std::byte left_over_byte;
        coins_file >> left_over_byte;
    } catch (const std::ios_base::failure&) {
        // We expect an exception since we should be out of coins.
        out_of_coins = true;
    }
    if (!out_of_coins) {
        return util::Error{strprintf(Untranslated("Bad snapshot - coins left over after deserializing %d coins"),
            coins_count)};
    }

    LogPrintf("[snapshot] loaded %d (%.2f MB) coins from snapshot %s\n",
        coins_count,
        coins_cache.DynamicMemoryUsage() / (1000 * 1000),
        base_blockhash.ToString());

    // No need to acquire cs_main since this chainstate isn't being used yet.
    FlushSnapshotToDisk(coins_cache, /*snapshot_loaded=*/true);

    assert(coins_cache.GetBestBlock() == base_blockhash);

    // As above, okay to immediately release cs_main here since no other context knows
    // about the snapshot_chainstate.
    CCoinsViewDB* snapshot_coinsdb = WITH_LOCK(::cs_main, return &snapshot_chainstate.CoinsDB());

    std::optional<CCoinsStats> maybe_stats;

    try {
        maybe_stats = ComputeUTXOStats(
            CoinStatsHashType::HASH_SERIALIZED, snapshot_coinsdb, m_blockman, [&interrupt = m_interrupt] { SnapshotUTXOHashBreakpoint(interrupt); });
    } catch (StopHashingException const&) {
        return util::Error{Untranslated("Aborting after an interrupt was requested")};
    }
    if (!maybe_stats.has_value()) {
        return util::Error{Untranslated("Failed to generate coins stats")};
    }

    // Assert that the deserialized chainstate contents match the expected assumeutxo value.
    if (AssumeutxoHash{maybe_stats->hashSerialized} != au_data.hash_serialized) {
        return util::Error{strprintf(Untranslated("Bad snapshot content hash: expected %s, got %s"),
            au_data.hash_serialized.ToString(), maybe_stats->hashSerialized.ToString())};
    }

    snapshot_chainstate.m_chain.SetTip(*snapshot_start_block);

    // The remainder of this function requires modifying data protected by cs_main.
    LOCK(::cs_main);

    // Fake various pieces of CBlockIndex state:
    CBlockIndex* index = nullptr;

    // Don't make any modifications to the genesis block since it shouldn't be
    // necessary, and since the genesis block doesn't have normal flags like
    // BLOCK_VALID_SCRIPTS set.
    constexpr int AFTER_GENESIS_START{1};

    for (int i = AFTER_GENESIS_START; i <= snapshot_chainstate.m_chain.Height(); ++i) {
        index = snapshot_chainstate.m_chain[i];

        // Fake BLOCK_OPT_WITNESS so that Chainstate::NeedsRedownload()
        // won't ask for -reindex on startup.
        if (DeploymentActiveAt(*index, *this, Consensus::DEPLOYMENT_SEGWIT)) {
            index->nStatus |= BLOCK_OPT_WITNESS;
        }

        m_blockman.m_dirty_blockindex.insert(index);
        // Changes to the block index will be flushed to disk after this call
        // returns in `ActivateSnapshot()`, when `MaybeRebalanceCaches()` is
        // called, since we've added a snapshot chainstate and therefore will
        // have to downsize the IBD chainstate, which will result in a call to
        // `FlushStateToDisk(ALWAYS)`.
    }

    assert(index);
    assert(index == snapshot_start_block);
    index->m_chain_tx_count = au_data.m_chain_tx_count;
    snapshot_chainstate.setBlockIndexCandidates.insert(snapshot_start_block);

    LogPrintf("[snapshot] validated snapshot (%.2f MB)\n",
        coins_cache.DynamicMemoryUsage() / (1000 * 1000));
    return {};
}